

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int make_table_recurse(archive_read *a,huffman_code *code,int node,huffman_table_entry *table,
                      int depth,int maxdepth)

{
  uint uVar1;
  ulong uVar2;
  char *fmt;
  ulong uVar3;
  huffman_tree_node *phVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint local_40;
  
  phVar4 = code->tree;
  if (phVar4 == (huffman_tree_node *)0x0) {
    fmt = "Huffman tree was not created.";
    uVar7 = 0;
  }
  else {
    if (node < 0) {
      uVar7 = 0;
    }
    else {
      iVar5 = maxdepth - depth;
      uVar7 = 0;
      local_40 = depth;
      do {
        if (code->numentries <= node) break;
        uVar6 = 1 << ((byte)iVar5 & 0x1f);
        if (phVar4[(uint)node].branches[0] == phVar4[(uint)node].branches[1]) {
          if (local_40 - maxdepth != -0x1f) {
            uVar2 = 1;
            if (1 < (int)uVar6) {
              uVar2 = (ulong)uVar6;
            }
            uVar6 = 0;
            uVar3 = 0;
            do {
              table[uVar3].length = local_40;
              table[uVar3].value = phVar4[(uint)node].branches[0];
              uVar3 = uVar3 + 1;
            } while (uVar2 != uVar3);
            goto LAB_0017b113;
          }
LAB_0017b16a:
          uVar6 = 0;
          goto LAB_0017b113;
        }
        if (local_40 == maxdepth) {
          table->length = maxdepth + 1;
          table->value = node;
          goto LAB_0017b16a;
        }
        local_40 = local_40 + 1;
        uVar1 = make_table_recurse(a,code,phVar4[(uint)node].branches[0],table,local_40,maxdepth);
        phVar4 = code->tree;
        node = phVar4[(uint)node].branches[1];
        table = table + (int)uVar6 / 2;
        uVar7 = uVar7 | uVar1;
        iVar5 = iVar5 + -1;
      } while (-1 < node);
    }
    fmt = "Invalid location to Huffman tree specified.";
  }
  archive_set_error(&a->archive,0x54,fmt);
  uVar6 = 0xffffffe2;
LAB_0017b113:
  return uVar7 | uVar6;
}

Assistant:

static int
make_table_recurse(struct archive_read *a, struct huffman_code *code, int node,
                   struct huffman_table_entry *table, int depth,
                   int maxdepth)
{
  int currtablesize, i, ret = (ARCHIVE_OK);

  if (!code->tree)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Huffman tree was not created.");
    return (ARCHIVE_FATAL);
  }
  if (node < 0 || node >= code->numentries)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid location to Huffman tree specified.");
    return (ARCHIVE_FATAL);
  }

  currtablesize = 1 << (maxdepth - depth);

  if (code->tree[node].branches[0] ==
    code->tree[node].branches[1])
  {
    for(i = 0; i < currtablesize; i++)
    {
      table[i].length = depth;
      table[i].value = code->tree[node].branches[0];
    }
  }
  else if (node < 0)
  {
    for(i = 0; i < currtablesize; i++)
      table[i].length = -1;
  }
  else
  {
    if(depth == maxdepth)
    {
      table[0].length = maxdepth + 1;
      table[0].value = node;
    }
    else
    {
      ret |= make_table_recurse(a, code, code->tree[node].branches[0], table,
                                depth + 1, maxdepth);
      ret |= make_table_recurse(a, code, code->tree[node].branches[1],
                         table + currtablesize / 2, depth + 1, maxdepth);
    }
  }
  return ret;
}